

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

Read<int> __thiscall Omega_h::expand<int>(Omega_h *this,Read<int> *a_data,LOs *a2b,Int width)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  ulong uVar3;
  Read<int> *pRVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  Alloc *pAVar8;
  void *extraout_RDX;
  ulong uVar9;
  Read<int> RVar10;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> b_data;
  string __str;
  ScopedTimer local_f9;
  Write<int> local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Write<int> local_b8;
  LOs local_a8;
  Read<int> local_98;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  Write<int> local_68;
  long *local_58 [2];
  long local_48 [2];
  Read<int> *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
  pAVar8 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar8) {
    local_e8._0_8_ = pAVar8->size;
    local_e8._8_8_ = plVar6[3];
    local_f8.shared_alloc_.alloc = (Alloc *)local_e8;
  }
  else {
    local_e8._0_8_ = pAVar8->size;
    local_f8.shared_alloc_.alloc = (Alloc *)*plVar6;
  }
  local_f8.shared_alloc_.direct_ptr = (void *)plVar6[1];
  *plVar6 = (long)pAVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_88 = local_78;
  local_38 = a_data;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,3,0x7b);
  uVar3 = (long)(size_t *)local_f8.shared_alloc_.direct_ptr + local_80;
  uVar9 = 0xf;
  if (local_f8.shared_alloc_.alloc != (Alloc *)local_e8) {
    uVar9 = local_e8._0_8_;
  }
  if (uVar9 < uVar3) {
    uVar9 = 0xf;
    if (local_88 != local_78) {
      uVar9 = local_78[0];
    }
    if (uVar3 <= uVar9) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_88,0,(char *)0x0,(ulong)local_f8.shared_alloc_.alloc);
      goto LAB_00302351;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_88);
LAB_00302351:
  local_d8._0_8_ = &local_c8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 == paVar1) {
    local_c8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_c8._8_8_ = puVar7[3];
  }
  else {
    local_c8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar7;
  }
  local_d8._8_8_ = puVar7[1];
  *puVar7 = paVar1;
  puVar7[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  begin_code("expand",(char *)local_d8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_f8.shared_alloc_.alloc != (Alloc *)local_e8) {
    operator_delete(local_f8.shared_alloc_.alloc,local_e8._0_8_ + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  iVar5 = Read<int>::last(a2b);
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
  Write<int>::Write(&local_f8,iVar5 * width,(string *)local_d8);
  pRVar4 = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
  }
  local_98.write_.shared_alloc_.alloc = (pRVar4->write_).shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.write_.shared_alloc_.alloc)->use_count =
           (local_98.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (pRVar4->write_).shared_alloc_.direct_ptr;
  local_a8.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a8.write_.shared_alloc_.alloc)->use_count =
           (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a8.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
  local_68.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_68.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
  expand_into<int>(&local_98,&local_a8,&local_68,width);
  pAVar8 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar8);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  local_b8.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
  local_b8.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
  if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
       local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
    local_b8.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_f8.shared_alloc_.alloc = (Alloc *)0x0;
  local_f8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<int>::Read((Read<signed_char> *)this,&local_b8);
  pAVar8 = local_b8.shared_alloc_.alloc;
  if (((ulong)local_b8.shared_alloc_.alloc & 7) == 0 && local_b8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_b8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar8);
      operator_delete(pAVar8,0x48);
    }
  }
  pAVar8 = local_f8.shared_alloc_.alloc;
  if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 && local_f8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_f8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_f8.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_f9);
  RVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<T> expand(Read<T> a_data, LOs a2b, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto nb = a2b.last();
  Write<T> b_data(nb * width);
  expand_into(a_data, a2b, b_data, width);
  return b_data;
}